

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpdf.cpp
# Opt level: O0

void __thiscall QPdf::ByteStream::ByteStream(ByteStream *this,bool fileBacking)

{
  long lVar1;
  long *plVar2;
  QBuffer *this_00;
  byte in_SIL;
  undefined8 *in_RDI;
  long in_FS_OFFSET;
  OpenModeFlag in_stack_ffffffffffffffbc;
  undefined4 local_c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = (QBuffer *)operator_new(0x10);
  QBuffer::QBuffer(this_00,(QByteArray *)(in_RDI + 1),(QObject *)0x0);
  *in_RDI = this_00;
  QByteArray::QByteArray((QByteArray *)0x5f0ace);
  *(byte *)(in_RDI + 4) = in_SIL & 1;
  *(undefined1 *)((long)in_RDI + 0x21) = 0;
  *(undefined1 *)((long)in_RDI + 0x22) = 0;
  plVar2 = (long *)*in_RDI;
  QFlags<QIODeviceBase::OpenModeFlag>::QFlags
            ((QFlags<QIODeviceBase::OpenModeFlag> *)this_00,in_stack_ffffffffffffffbc);
  (**(code **)(*plVar2 + 0x68))(plVar2,local_c);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

ByteStream::ByteStream(bool fileBacking)
            : dev(new QBuffer(&ba)),
            fileBackingEnabled(fileBacking),
            fileBackingActive(false),
            handleDirty(false)
    {
        dev->open(QIODevice::ReadWrite);
    }